

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt_const&>
          (SmallVectorBase<slang::SVInt> *this,SVInt *args)

{
  size_type sVar1;
  pointer pSVar2;
  
  if (this->len == this->cap) {
    pSVar2 = emplaceRealloc<slang::SVInt_const&>(this,this->data_ + this->len,args);
    return pSVar2;
  }
  SVInt::SVInt(this->data_ + this->len,&args->super_SVIntStorage);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }